

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_long_long,_signed_char,_8>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *lhs,char *rhs,unsigned_long_long *result)

{
  uint32_t uVar1;
  ulong *in_RDX;
  char *in_RSI;
  ulong *in_RDI;
  uint64_t tmp;
  
  if (*in_RSI < '\0') {
    uVar1 = AbsValueHelper<signed_char,_0>::Abs('\0');
    if (*in_RDI < (ulong)uVar1) {
LAB_0021194e:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (ulong)uVar1;
  }
  else {
    if (*in_RDI + (long)*in_RSI < *in_RDI) goto LAB_0021194e;
    *in_RDX = *in_RDI + (long)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::uint64_t, rhs signed
        std::uint64_t tmp = 0;

        if( rhs < 0 )
        {
            // So we're effectively subtracting
            tmp = AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if( tmp <= lhs )
            {
                result = lhs - tmp;
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // We added and it did not become smaller
            if( tmp >= lhs )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }